

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuPrivate::scrollMenu(QMenuPrivate *this,ScrollLocation location,bool active)

{
  bool bVar1;
  ulong uVar2;
  QAction *action;
  uint uVar3;
  long lVar4;
  ScrollLocation SStack_30;
  
  updateActionRects(this);
  if (location == ScrollBottom) {
    uVar3 = (uint)(this->super_QWidgetPrivate).actions.d.size;
    do {
      do {
        uVar3 = uVar3 - 1;
        if ((int)uVar3 < 0) {
          return;
        }
        bVar1 = QRect::isNull((this->actionRects).d.ptr + (uVar3 & 0x7fffffff));
      } while (bVar1);
      action = (this->super_QWidgetPrivate).actions.d.ptr[uVar3 & 0x7fffffff];
      bVar1 = considerAction(this,action);
    } while (!bVar1);
    if ((this->scroll->scrollFlags & 2) != 0) {
      SStack_30 = ScrollBottom;
LAB_00421f81:
      scrollMenu(this,action,SStack_30,active);
      return;
    }
LAB_00421f52:
    if (active) {
      setCurrentAction(this,action,-1,SelectedFromKeyboard,false);
      return;
    }
  }
  else if (location == ScrollTop) {
    lVar4 = 0;
    for (uVar2 = 0; uVar2 < (ulong)(this->super_QWidgetPrivate).actions.d.size; uVar2 = uVar2 + 1) {
      bVar1 = QRect::isNull((QRect *)((long)&(((this->actionRects).d.ptr)->x1).m_i + lVar4));
      if (!bVar1) {
        action = (this->super_QWidgetPrivate).actions.d.ptr[uVar2];
        bVar1 = considerAction(this,action);
        if (bVar1) {
          if ((this->scroll->scrollFlags & 1) == 0) goto LAB_00421f52;
          SStack_30 = ScrollTop;
          goto LAB_00421f81;
        }
      }
      lVar4 = lVar4 + 0x10;
    }
  }
  return;
}

Assistant:

void QMenuPrivate::scrollMenu(QMenuScroller::ScrollLocation location, bool active)
{
    updateActionRects();
    if (location == QMenuScroller::ScrollBottom) {
        for(int i = actions.size()-1; i >= 0; --i) {
            if (actionRects.at(i).isNull())
                continue;
            QAction *act = actions.at(i);
            if (considerAction(act)) {
                if (scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
                    scrollMenu(act, QMenuPrivate::QMenuScroller::ScrollBottom, active);
                else if (active)
                    setCurrentAction(act, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                break;
            }
        }
    } else if (location == QMenuScroller::ScrollTop) {
        for(int i = 0; i < actions.size(); ++i) {
            if (actionRects.at(i).isNull())
                continue;
            QAction *act = actions.at(i);
            if (considerAction(act)) {
                if (scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                    scrollMenu(act, QMenuPrivate::QMenuScroller::ScrollTop, active);
                else if (active)
                    setCurrentAction(act, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                break;
            }
        }
    }
}